

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask27_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar13 [64];
  
  auVar16 = vpmovsxbd_avx(ZEXT416(0x1010004));
  auVar15 = vpmovsxbd_avx(ZEXT416(0x6010012));
  auVar10 = vpmovsxbd_avx512f(_DAT_001a4e60);
  auVar11 = vpmovsxbd_avx512f(_DAT_001a2890);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(in + 2);
  auVar5 = vpermi2d_avx512vl(auVar16,auVar5,ZEXT416(in[1]));
  vpmovsxbd_avx2(ZEXT816(0x342c2824201c1410));
  auVar6 = vpbroadcastd_avx512vl();
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[6] << 2)));
  auVar8 = valignd_avx512vl(auVar7,auVar7,5);
  auVar10 = vpermi2d_avx512f(auVar10,ZEXT3264(auVar7),ZEXT1664(auVar5));
  auVar9 = vpbroadcastd_avx512vl();
  auVar6 = vpor_avx2(auVar6,auVar9);
  auVar16 = vpinsrd_avx(auVar5,in[0xc] << 4,1);
  auVar8 = vpblendd_avx2(auVar8,ZEXT1632(auVar5),7);
  auVar8 = vpsrlvd_avx2(auVar8,_DAT_0019ff00);
  auVar6 = vpblendd_avx2(auVar8,auVar6,0x10);
  auVar12 = vpmovsxbd_avx512f(_DAT_00194230);
  auVar5 = vpinsrd_avx(auVar15,auVar7._24_4_ >> 0x17,1);
  auVar5 = vpor_avx(auVar16,auVar5);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(in + 0xe);
  auVar16 = vpalignr_avx(auVar16,auVar7._16_16_,4);
  auVar10 = vpermi2d_avx512f(auVar11,auVar10,ZEXT864(*(ulong *)(in + 0xe)));
  auVar16 = vpsrlvd_avx2(auVar16,auVar15);
  auVar16 = vpblendd_avx2(auVar16,auVar5,2);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(in + 0x10);
  auVar5 = vpsrlvd_avx2(auVar15,_DAT_001a2db0);
  auVar10 = vpermi2d_avx512f(auVar12,auVar10,ZEXT864(*(ulong *)(in + 0x10)));
  auVar11 = vpmovsxbd_avx512f(_DAT_00194250);
  auVar12 = vpbroadcastd_avx512f();
  auVar12._0_60_ = auVar10._0_60_;
  auVar10 = vpsllvd_avx512f(auVar12,_DAT_001af680);
  uVar1 = in[0x17];
  auVar11 = vpermi2d_avx512f(auVar11,ZEXT3264(auVar6),ZEXT464(*in));
  auVar12 = vpmovsxbd_avx512f(_DAT_00194260);
  auVar15 = vpmovsxbd_avx(ZEXT416(0xe090400));
  auVar11 = vpermi2d_avx512f(auVar12,auVar11,ZEXT1664(auVar16));
  auVar12 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar16 = vpinsrd_avx(auVar15,in[0x12] >> 0x1a,0);
  auVar13 = vpbroadcastd_avx512f();
  auVar14._0_52_ = auVar11._0_52_;
  auVar14._52_4_ = auVar13._52_4_;
  auVar14._56_4_ = auVar11._56_4_;
  auVar14._60_4_ = auVar11._60_4_;
  uVar2 = in[0x13];
  auVar11 = vpermi2q_avx512f(auVar12,auVar14,ZEXT1664(auVar5));
  auVar10 = vpord_avx512f(auVar10,auVar11);
  auVar10 = vmovdqu64_avx512f(auVar10);
  *(undefined1 (*) [64])out = auVar10;
  auVar3 = vpshufd_avx(*(undefined1 (*) [16])(in + 0x14),0x90);
  auVar4 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 0x14),_DAT_001a1c50);
  auVar5 = vpinsrd_avx(auVar3,uVar2 * 2,0);
  auVar15 = vpsrlvd_avx2(auVar3,auVar15);
  auVar16 = vpor_avx(auVar5,auVar16);
  auVar16 = vpblendd_avx2(auVar15,auVar16,1);
  auVar16 = vpor_avx(auVar4,auVar16);
  *(undefined1 (*) [16])(out + 0x10) = auVar16;
  out[0x14] = uVar1 >> 0x13;
  return out + 0x15;
}

Assistant:

uint32_t *__fastpackwithoutmask27_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (27 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (27 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (27 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (27 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++out;
  *out = ((*in)) >> (27 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (27 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (27 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (27 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (27 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++out;
  *out = ((*in)) >> (27 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (27 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (27 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (27 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (27 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (27 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  *out = ((*in)) >> (27 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (27 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (27 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (27 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  *out = ((*in)) >> (27 - 8);
  ++in;

  return out + 1;
}